

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

string * __thiscall
wallet::LabelFromValue_abi_cxx11_(string *__return_storage_ptr__,wallet *this,UniValue *value)

{
  bool bVar1;
  int iVar2;
  string *__lhs;
  UniValue *__return_storage_ptr___00;
  long in_FS_OFFSET;
  allocator<char> local_41;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (LabelFromValue[abi:cxx11](UniValue_const&)::empty_string_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&LabelFromValue[abi:cxx11](UniValue_const&)::empty_string_abi_cxx11_
                               );
    if (iVar2 != 0) {
      LabelFromValue[abi:cxx11](UniValue_const&)::empty_string_abi_cxx11_._M_dataplus._M_p =
           (pointer)&LabelFromValue[abi:cxx11](UniValue_const&)::empty_string_abi_cxx11_.field_2;
      LabelFromValue[abi:cxx11](UniValue_const&)::empty_string_abi_cxx11_._M_string_length = 0;
      LabelFromValue[abi:cxx11](UniValue_const&)::empty_string_abi_cxx11_.field_2._M_local_buf[0] =
           '\0';
      __cxa_atexit(std::__cxx11::string::~string,
                   &LabelFromValue[abi:cxx11](UniValue_const&)::empty_string_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&LabelFromValue[abi:cxx11](UniValue_const&)::empty_string_abi_cxx11_);
    }
  }
  if (*(int *)this == 0) {
    __lhs = &LabelFromValue[abi:cxx11](UniValue_const&)::empty_string_abi_cxx11_;
  }
  else {
    __lhs = UniValue::get_str_abi_cxx11_((UniValue *)this);
    bVar1 = std::operator==(__lhs,"*");
    if (bVar1) {
      __return_storage_ptr___00 = (UniValue *)__cxa_allocate_exception(0x58);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"Invalid label name",&local_41);
      JSONRPCError(__return_storage_ptr___00,-0xb,&local_40);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        __cxa_throw(__return_storage_ptr___00,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_005355dc;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,__lhs);
    return __return_storage_ptr__;
  }
LAB_005355dc:
  __stack_chk_fail();
}

Assistant:

std::string LabelFromValue(const UniValue& value)
{
    static const std::string empty_string;
    if (value.isNull()) return empty_string;

    const std::string& label{value.get_str()};
    if (label == "*")
        throw JSONRPCError(RPC_WALLET_INVALID_LABEL_NAME, "Invalid label name");
    return label;
}